

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_utils.c
# Opt level: O0

void MD5Final(uchar *digest,MD5Context *ctx)

{
  uint uVar1;
  int iVar2;
  undefined1 *puVar3;
  uint *in_RSI;
  undefined8 *in_RDI;
  uchar *p;
  int count;
  uint *local_20;
  int local_14;
  
  uVar1 = in_RSI[4];
  puVar3 = (undefined1 *)((long)in_RSI + (long)(int)(uVar1 & 0x3f) + 0x18);
  local_20 = (uint *)(puVar3 + 1);
  *puVar3 = 0x80;
  iVar2 = -(uVar1 & 0x3f);
  local_14 = iVar2 + 0x37;
  if (local_14 < 0) {
    memset(local_20,0,(long)(iVar2 + 0x3f));
    byteSwap(in_RSI + 6,0x10);
    MD5Transform(in_RSI,in_RSI + 6);
    local_20 = in_RSI + 6;
    local_14 = 0x38;
  }
  memset(local_20,0,(long)local_14);
  byteSwap(in_RSI + 6,0xe);
  in_RSI[0x14] = in_RSI[4] << 3;
  in_RSI[0x15] = in_RSI[5] << 3 | in_RSI[4] >> 0x1d;
  MD5Transform(in_RSI,in_RSI + 6);
  byteSwap(in_RSI,4);
  *in_RDI = *(undefined8 *)in_RSI;
  in_RDI[1] = *(undefined8 *)(in_RSI + 2);
  memset(in_RSI,0,0x58);
  return;
}

Assistant:

void MD5Final(md5byte digest[16], struct MD5Context *ctx) {
  int count = ctx->bytes[0] & 0x3f; /* Number of bytes in ctx->in */
  md5byte *p = (md5byte *)ctx->in + count;

  /* Set the first char of padding to 0x80.  There is always room. */
  *p++ = 0x80;

  /* Bytes of padding needed to make 56 bytes (-8..55) */
  count = 56 - 1 - count;

  if (count < 0) { /* Padding forces an extra block */
    memset(p, 0, count + 8);
    byteSwap(ctx->in, 16);
    MD5Transform(ctx->buf, ctx->in);
    p = (md5byte *)ctx->in;
    count = 56;
  }

  memset(p, 0, count);
  byteSwap(ctx->in, 14);

  /* Append length in bits and transform */
  ctx->in[14] = ctx->bytes[0] << 3;
  ctx->in[15] = ctx->bytes[1] << 3 | ctx->bytes[0] >> 29;
  MD5Transform(ctx->buf, ctx->in);

  byteSwap(ctx->buf, 4);
  memcpy(digest, ctx->buf, 16);
  memset(ctx, 0, sizeof(*ctx)); /* In case it's sensitive */
}